

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::OneofDescriptor::CopyTo(OneofDescriptor *this,OneofDescriptorProto *proto)

{
  string_view value;
  uint32_t *puVar1;
  Arena *arena;
  OneofOptions *pOVar2;
  OneofOptions *pOVar3;
  string_view local_50;
  OneofDescriptorProto *local_40;
  OneofDescriptorProto *proto_local;
  OneofDescriptor *this_local;
  char *local_28;
  string_view *local_20;
  OneofDescriptorProto *local_18;
  anon_union_24_1_493b367e_for_OneofDescriptorProto_3 *local_10;
  
  local_40 = proto;
  proto_local = (OneofDescriptorProto *)this;
  local_50 = name(this);
  local_20 = &local_50;
  local_10 = &proto->field_0;
  local_18 = proto;
  puVar1 = internal::HasBits<1>::operator[](&(proto->field_0)._impl_._has_bits_,0);
  *puVar1 = *puVar1 | 1;
  this_local = (OneofDescriptor *)local_20->_M_len;
  local_28 = local_20->_M_str;
  arena = MessageLite::GetArena((MessageLite *)proto);
  value._M_str = local_28;
  value._M_len = (size_t)this_local;
  internal::ArenaStringPtr::Set(&(proto->field_0)._impl_.name_,value,arena);
  pOVar2 = options(this);
  pOVar3 = OneofOptions::default_instance();
  if (pOVar2 != pOVar3) {
    pOVar2 = options(this);
    pOVar3 = OneofDescriptorProto::mutable_options(local_40);
    OneofOptions::operator=(pOVar3,pOVar2);
  }
  anon_unknown_24::RestoreFeaturesToOptions<google::protobuf::OneofDescriptorProto>
            (this->proto_features_,local_40);
  return;
}

Assistant:

void OneofDescriptor::CopyTo(OneofDescriptorProto* proto) const {
  proto->set_name(name());
  if (&options() != &OneofOptions::default_instance()) {
    *proto->mutable_options() = options();
  }
  RestoreFeaturesToOptions(proto_features_, proto);
}